

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpatch.hpp
# Opt level: O3

void __thiscall
jsoncons::jsonpatch::detail::
operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::~operation_unwinder
          (operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this)

{
  op_type oVar1;
  pointer peVar2;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *value;
  entry *peVar3;
  error_code ec;
  error_code local_28;
  
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  if ((this->state != commit) &&
     (peVar2 = (this->stack).
               super__Vector_base<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>
               ._M_impl.super__Vector_impl_data._M_finish,
     peVar2 != (this->stack).
               super__Vector_base<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>
               ._M_impl.super__Vector_impl_data._M_start)) {
    value = &peVar2[-1].value;
    do {
      oVar1 = ((entry *)(value + -2))->op;
      if (oVar1 == replace) {
        jsonpointer::
        replace<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
                  (this->target,&((entry *)(value + -2))->path,value,false,&local_28);
LAB_0039bfc1:
        if (local_28._M_value != 0) break;
      }
      else {
        if (oVar1 == remove) {
          jsonpointer::
          remove<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                    (this->target,&((entry *)(value + -2))->path,&local_28);
          goto LAB_0039bfc1;
        }
        if (oVar1 == add) {
          jsonpointer::
          add<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
                    (this->target,&((entry *)(value + -2))->path,value,false,&local_28);
          goto LAB_0039bfc1;
        }
      }
      peVar3 = (entry *)(value + -2);
      value = value + -3;
    } while (peVar3 != (this->stack).
                       super__Vector_base<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry,_std::allocator<jsoncons::jsonpatch::detail::operation_unwinder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::entry>_>
  ::~vector(&this->stack);
  return;
}

Assistant:

~operation_unwinder() noexcept
        {
            std::error_code ec;
            if (state != state_type::commit)
            {
                for (auto it = stack.rbegin(); it != stack.rend(); ++it)
                {
                    if ((*it).op == op_type::add)
                    {
                        jsonpointer::add(target,(*it).path,(*it).value,ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            //std::cout << "add: " << (*it).path << '\n';
                            break;
                        }
                    }
                    else if ((*it).op == op_type::remove)
                    {
                        jsonpointer::remove(target,(*it).path,ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            //std::cout << "remove: " << (*it).path << '\n';
                            break;
                        }
                    }
                    else if ((*it).op == op_type::replace)
                    {
                        jsonpointer::replace(target,(*it).path,(*it).value,ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            //std::cout << "replace: " << (*it).path << '\n';
                            break;
                        }
                    }
                }
            }
        }